

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings(SimpleParallelAnalyzerSettings *this)

{
  pointer *pppAVar1;
  AnalyzerSettingInterfaceNumberList *pAVar2;
  AnalyzerSettingInterfaceChannel *pAVar3;
  AnalyzerSettingInterfaceChannel *this_00;
  AnalyzerSettingInterfaceNumberList *this_01;
  Channel *pCVar4;
  iterator __position;
  uint uVar5;
  ulong uVar6;
  U32 i_1;
  U32 i;
  long lVar7;
  AnalyzerSettingInterfaceChannel *data_channel_interface;
  char text [64];
  AnalyzerSettingInterfaceChannel *local_90;
  Channel *local_88;
  vector<AnalyzerSettingInterfaceChannel*,std::allocator<AnalyzerSettingInterfaceChannel*>>
  *local_80;
  Channel local_78 [72];
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SimpleParallelAnalyzerSettings_0010ad00;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = &this->mClockChannel;
  Channel::Channel(local_88,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mClockEdge = PosEdge;
  local_80 = (vector<AnalyzerSettingInterfaceChannel*,std::allocator<AnalyzerSettingInterfaceChannel*>>
              *)&this->mDataChannelsInterface;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mClockChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mClockEdgeInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  uVar6 = 0;
  do {
    Channel::Channel(local_78,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    pCVar4 = local_78;
    std::vector<Channel,_std::allocator<Channel>_>::emplace_back<Channel>
              (&this->mDataChannels,local_78);
    Channel::~Channel(local_78);
    pAVar3 = (AnalyzerSettingInterfaceChannel *)
             AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
    AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar3);
    local_90 = pAVar3;
    sprintf((char *)local_78,"D%d",uVar6 & 0xffffffff);
    AnalyzerSettingInterface::SetTitleAndTooltip((char *)local_90,(char *)local_78);
    AnalyzerSettingInterfaceChannel::SetChannel((Channel *)local_90);
    AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed(SUB81(local_90,0));
    __position._M_current =
         (this->mDataChannelsInterface).
         super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->mDataChannelsInterface).
        super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<AnalyzerSettingInterfaceChannel*,std::allocator<AnalyzerSettingInterfaceChannel*>>
      ::_M_realloc_insert<AnalyzerSettingInterfaceChannel*const&>(local_80,__position,&local_90);
    }
    else {
      *__position._M_current = local_90;
      pppAVar1 = &(this->mDataChannelsInterface).
                  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + 1;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x10);
  this_00 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new
                      ((AnalyzerSettingInterface *)0x18,(ulong)__position._M_current);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  pAVar3 = (this->mClockChannelInterface)._M_ptr;
  if (pAVar3 != this_00) {
    if (pAVar3 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar3 + 8))();
    }
    (this->mClockChannelInterface)._M_ptr = this_00;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mClockChannelInterface)._M_ptr,"Text above");
  pCVar4 = local_88;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mClockChannelInterface)._M_ptr);
  this_01 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_01);
  pAVar2 = (this->mClockEdgeInterface)._M_ptr;
  if (pAVar2 != this_01) {
    if (pAVar2 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar2 + 8))();
    }
    (this->mClockEdgeInterface)._M_ptr = this_01;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)(this->mClockEdgeInterface)._M_ptr,"");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mClockEdgeInterface)._M_ptr,"Data is valid on Clock rising edge");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mClockEdgeInterface)._M_ptr,"Data is valid on Clock falling edge");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mClockEdge);
  lVar7 = 0;
  do {
    AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar5 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar5,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  lVar7 = 0;
  uVar6 = 0;
  do {
    sprintf((char *)local_78,"D%d",uVar6 & 0xffffffff);
    AnalyzerSettings::AddChannel
              ((Channel *)this,
               (char *)((this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar7),SUB81(local_78,0));
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x10;
  } while (uVar6 != 0x10);
  return;
}

Assistant:

SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings()
:
	mClockChannel( UNDEFINED_CHANNEL ),
	mClockEdge( AnalyzerEnums::PosEdge )
{
	U32 count = 16;
	for( U32 i=0; i<count; i++ )
	{
		mDataChannels.push_back( UNDEFINED_CHANNEL );
		AnalyzerSettingInterfaceChannel* data_channel_interface = new AnalyzerSettingInterfaceChannel();
		
		char text[64];
		sprintf( text, "D%d", i );

		data_channel_interface->SetTitleAndTooltip( text, text );
		data_channel_interface->SetChannel( mDataChannels[i] );
		data_channel_interface->SetSelectionOfNoneIsAllowed( true );

		mDataChannelsInterface.push_back( data_channel_interface );
	}

	//The remainder of the old clock channel stuff provides a means to select
	//where the output goes in the waveform window. There is no clock anymore.
	mClockChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
	mClockChannelInterface->SetTitleAndTooltip( "Text above", "Analyzer displays output above this channel" );
	mClockChannelInterface->SetChannel( mClockChannel );

	mClockEdgeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
	mClockEdgeInterface->SetTitleAndTooltip( "", "" );
	mClockEdgeInterface->AddNumber( AnalyzerEnums::PosEdge, "Data is valid on Clock rising edge", "Data is valid on Clock rising edge" );
	mClockEdgeInterface->AddNumber( AnalyzerEnums::NegEdge, "Data is valid on Clock falling edge", "Data is valid on Clock falling edge" );
	mClockEdgeInterface->SetNumber( mClockEdge );



	for( U32 i=0; i<count; i++ )
	{
		AddInterface( mDataChannelsInterface[i] );
	}

	AddInterface( mClockChannelInterface.get() );
	//AddInterface( mClockEdgeInterface.get() ); removes clock edge from the settings page

	AddExportOption( 0, "Export as text/csv file" );
	AddExportExtension( 0, "text", "txt" );
	AddExportExtension( 0, "csv", "csv" );

	ClearChannels();
	for( U32 i=0; i<count; i++ )
	{
		char text[64];
		sprintf( text, "D%d", i );
		AddChannel( mDataChannels[i], text, false );
	}
}